

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

CURLcode Curl_ssl_addsessionid
                   (Curl_cfilter *cf,Curl_easy *data,void *ssl_sessionid,size_t idsize,_Bool *added)

{
  void *pvVar1;
  connectdata *pcVar2;
  Curl_share *pCVar3;
  ulong uVar4;
  Curl_ssl_session *pCVar5;
  long lVar6;
  _Bool _Var7;
  int iVar8;
  char *pcVar9;
  connectdata *pcVar10;
  ulong uVar11;
  ConnectBits CVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  Curl_ssl_session *session;
  long *plVar16;
  long lVar17;
  char *local_60;
  
  lVar17 = 0x1c0;
  if (cf->cft == &Curl_cft_ssl_proxy) {
    lVar17 = 0x230;
  }
  pvVar1 = cf->ctx;
  pcVar2 = cf->conn;
  if (added != (_Bool *)0x0) {
    *added = false;
  }
  session = (data->state).session;
  if (session == (Curl_ssl_session *)0x0) {
    return CURLE_OK;
  }
  lVar14 = session->age;
  pcVar9 = (*Curl_cstrdup)(*(char **)((long)pvVar1 + 8));
  if (pcVar9 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  pcVar10 = cf->conn;
  CVar12 = pcVar10->bits;
  if (((uint)CVar12 >> 9 & 1) == 0) {
    local_60 = (char *)0x0;
  }
  else {
    local_60 = (*Curl_cstrdup)((pcVar10->conn_to_host).name);
    if (local_60 == (char *)0x0) {
      (*Curl_cfree)(pcVar9);
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar10 = cf->conn;
    CVar12 = pcVar10->bits;
  }
  if (((uint)CVar12 >> 10 & 1) == 0) {
    iVar8 = -1;
  }
  else {
    iVar8 = pcVar10->conn_to_port;
  }
  pCVar3 = data->share;
  if ((pCVar3 == (Curl_share *)0x0) || ((pCVar3->specifier & 0x10) == 0)) {
    plVar16 = &(data->state).sessionage;
  }
  else {
    plVar16 = &pCVar3->sessionage;
  }
  uVar4 = (data->set).general_ssl.max_ssl_sessions;
  uVar13 = 1;
  for (lVar15 = 0xa8;
      (uVar11 = uVar4 + (uVar4 == 0), uVar13 < uVar4 &&
      (pCVar5 = (data->state).session, uVar11 = uVar13,
      *(long *)((long)&pCVar5->sessionid + lVar15) != 0)); lVar15 = lVar15 + 0xa8) {
    lVar6 = *(long *)((long)&pCVar5->age + lVar15);
    if (lVar6 < lVar14) {
      lVar14 = lVar6;
      session = (Curl_ssl_session *)((long)&pCVar5->name + lVar15);
    }
    uVar13 = uVar13 + 1;
  }
  if (uVar11 == uVar4) {
    Curl_ssl_kill_session(session);
  }
  else {
    session = (data->state).session + uVar11;
  }
  session->sessionid = ssl_sessionid;
  session->idsize = idsize;
  session->age = *plVar16;
  (*Curl_cfree)(session->name);
  (*Curl_cfree)(session->conn_to_host);
  session->name = pcVar9;
  session->conn_to_host = local_60;
  session->conn_to_port = iVar8;
  session->remote_port = *(int *)((long)pvVar1 + 0x50);
  session->scheme = cf->conn->handler->scheme;
  _Var7 = clone_ssl_primary_config
                    ((ssl_primary_config *)((long)&(pcVar2->bundle_node).ptr + lVar17),
                     &session->ssl_config);
  if (!_Var7) {
    Curl_free_primary_ssl_config(&session->ssl_config);
    session->sessionid = (void *)0x0;
    (*Curl_cfree)(pcVar9);
    (*Curl_cfree)(local_60);
    return CURLE_OUT_OF_MEMORY;
  }
  if (added != (_Bool *)0x0) {
    *added = true;
    return CURLE_OK;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_ssl_addsessionid(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               void *ssl_sessionid,
                               size_t idsize,
                               bool *added)
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct ssl_config_data *ssl_config = Curl_ssl_cf_get_config(cf, data);
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  size_t i;
  struct Curl_ssl_session *store;
  long oldest_age;
  char *clone_host;
  char *clone_conn_to_host;
  int conn_to_port;
  long *general_age;

  if(added)
    *added = FALSE;

  if(!data->state.session)
    return CURLE_OK;

  store = &data->state.session[0];
  oldest_age = data->state.session[0].age; /* zero if unused */
  (void)ssl_config;
  DEBUGASSERT(ssl_config->primary.sessionid);

  clone_host = strdup(connssl->peer.hostname);
  if(!clone_host)
    return CURLE_OUT_OF_MEMORY; /* bail out */

  if(cf->conn->bits.conn_to_host) {
    clone_conn_to_host = strdup(cf->conn->conn_to_host.name);
    if(!clone_conn_to_host) {
      free(clone_host);
      return CURLE_OUT_OF_MEMORY; /* bail out */
    }
  }
  else
    clone_conn_to_host = NULL;

  if(cf->conn->bits.conn_to_port)
    conn_to_port = cf->conn->conn_to_port;
  else
    conn_to_port = -1;

  /* Now we should add the session ID and the host name to the cache, (remove
     the oldest if necessary) */

  /* If using shared SSL session, lock! */
  if(SSLSESSION_SHARED(data)) {
    general_age = &data->share->sessionage;
  }
  else {
    general_age = &data->state.sessionage;
  }

  /* find an empty slot for us, or find the oldest */
  for(i = 1; (i < data->set.general_ssl.max_ssl_sessions) &&
        data->state.session[i].sessionid; i++) {
    if(data->state.session[i].age < oldest_age) {
      oldest_age = data->state.session[i].age;
      store = &data->state.session[i];
    }
  }
  if(i == data->set.general_ssl.max_ssl_sessions)
    /* cache is full, we must "kill" the oldest entry! */
    Curl_ssl_kill_session(store);
  else
    store = &data->state.session[i]; /* use this slot */

  /* now init the session struct wisely */
  store->sessionid = ssl_sessionid;
  store->idsize = idsize;
  store->age = *general_age;    /* set current age */
  /* free it if there's one already present */
  free(store->name);
  free(store->conn_to_host);
  store->name = clone_host;               /* clone host name */
  store->conn_to_host = clone_conn_to_host; /* clone connect to host name */
  store->conn_to_port = conn_to_port; /* connect to port number */
  /* port number */
  store->remote_port = connssl->port;
  store->scheme = cf->conn->handler->scheme;

  if(!clone_ssl_primary_config(conn_config, &store->ssl_config)) {
    Curl_free_primary_ssl_config(&store->ssl_config);
    store->sessionid = NULL; /* let caller free sessionid */
    free(clone_host);
    free(clone_conn_to_host);
    return CURLE_OUT_OF_MEMORY;
  }

  if(added)
    *added = TRUE;

  DEBUGF(infof(data, "Added Session ID to cache for %s://%s:%d [%s]",
               store->scheme, store->name, store->remote_port,
               Curl_ssl_cf_is_proxy(cf) ? "PROXY" : "server"));
  return CURLE_OK;
}